

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_transform_kernel(Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  uint uVar11;
  int *piVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 *puVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar31;
  float fVar32;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  float z7;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int TILE_K;
  int TILE_M;
  Mat m;
  int TILE_N;
  uint local_170;
  uint local_16c;
  uint local_168;
  int local_164;
  uint local_160;
  uint local_15c;
  Mat local_158;
  undefined1 local_108 [48];
  int iStack_d8;
  undefined4 uStack_d4;
  int local_d0;
  size_t local_c8;
  ulong local_c0;
  ulong local_b8;
  Mat *local_b0;
  Mat *local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [12];
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  undefined8 uStack_78;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  float local_50;
  float fStack_4c;
  float fStack_48;
  undefined1 auStack_44 [16];
  
  local_b0 = kernel;
  get_optimal_tile_mnk
            (outch,0,inch,(int *)&local_16c,(int *)((long)&uStack_a0 + 4),(int *)&local_170,
             opt->num_threads);
  uVar11 = local_170;
  uVar19 = (int)(outch + local_16c + -1) / (int)local_16c;
  iVar18 = local_16c * local_170;
  local_158.cstep = 0;
  local_158.data = (void *)0x0;
  local_158.refcount._0_4_ = 0;
  local_158.refcount._4_4_ = 0;
  local_158.elemsize = 0;
  local_158.elempack = 0;
  local_158.allocator = (Allocator *)0x0;
  local_158.dims = 0;
  local_158.w = 0;
  local_158.h = 0;
  local_158.d = 0;
  local_158.c = 0;
  local_c0 = (ulong)(uint)outch;
  Mat::create(&local_158,iVar18 * 0x40,1,opt->num_threads,4,(Allocator *)0x0);
  local_a8 = AT;
  Mat::create(AT,iVar18,0x40,(int)(uVar11 + inch + -1) / (int)uVar11,uVar19,4,(Allocator *)0x0);
  if (0 < (int)uVar19) {
    local_164 = inch * 9;
    uVar22 = 0;
    local_168 = uVar19;
    do {
      iVar20 = local_16c * (int)uVar22;
      local_b8 = uVar22;
      iVar18 = get_omp_thread_num();
      local_108._0_8_ = (long)iVar18 * local_158.cstep * local_158.elemsize + (long)local_158.data;
      local_108._8_4_ = 0;
      local_108._12_4_ = 0;
      local_108._16_8_ = local_158.elemsize;
      local_108._24_4_ = local_158.elempack;
      local_108._32_8_ = local_158.allocator;
      auVar13._4_4_ = iStack_d8;
      auVar13._8_4_ = uStack_d4;
      auVar13._0_4_ = local_158.w;
      local_108._40_8_ = auVar13._0_8_ << 0x20;
      iStack_d8 = local_158.h;
      uStack_d4 = 1;
      local_d0 = local_158.d;
      local_108._40_4_ = local_158.dims + -1;
      local_c8 = (local_158.elemsize * (long)local_158.h * (long)local_158.w + 0xf &
                 0xfffffffffffffff0) / local_158.elemsize;
      if (local_158.dims == 4) {
        local_c8 = (long)local_158.h * (long)local_158.w;
      }
      if (0 < inch) {
        local_160 = (int)local_c0 - iVar20;
        iVar18 = 0;
        do {
          auVar15 = _DAT_0059aa70;
          auVar14 = _DAT_00599900;
          uVar11 = local_160;
          if ((int)local_16c < (int)local_160) {
            uVar11 = local_16c;
          }
          local_15c = local_170;
          uVar19 = inch - iVar18;
          if ((int)local_170 < inch - iVar18) {
            uVar19 = local_170;
          }
          if (0 < (int)uVar11) {
            lVar17 = (long)iVar18;
            auVar28 = vpmovsxbq_avx2(ZEXT416(0x24180c00));
            pvVar1 = local_b0->data;
            auVar29._8_8_ = pvVar1;
            auVar29._0_8_ = pvVar1;
            auVar29._16_8_ = pvVar1;
            auVar29._24_8_ = pvVar1;
            auVar28 = vpaddq_avx512vl(auVar28,auVar29);
            uVar22 = 0;
            puVar16 = (undefined4 *)local_108._0_8_;
            do {
              if (0 < (int)uVar19) {
                auVar29 = vpbroadcastq_avx512vl();
                auVar29 = vpsllq_avx2(auVar29,2);
                auVar29 = vpaddq_avx2(auVar28,auVar29);
                uVar23 = 0;
                do {
                  auVar30 = vpbroadcastq_avx512vl();
                  vpaddq_avx2(auVar29,auVar30);
                  auVar25 = vgatherqps_avx512vl(*(undefined8 *)
                                                 ((uVar23 + lVar17) * 0x24 + (ulong)uVar11));
                  auVar26 = vgatherqps_avx512vl(*(undefined8 *)(lVar17 + 4));
                  auVar27 = vgatherqps_avx512vl(*(undefined8 *)(lVar17 + 8));
                  fVar24 = auVar25._0_4_;
                  fVar31 = auVar25._4_4_;
                  fVar32 = auVar25._8_4_;
                  local_98._0_8_ = auVar25._0_8_;
                  auVar33._0_4_ = fVar24 * -0.22222222;
                  auVar33._4_4_ = fVar31 * -0.22222222;
                  auVar33._8_4_ = fVar32 * -0.22222222;
                  fVar9 = auVar25._12_4_;
                  auVar33._12_4_ = fVar9 * -0.22222222;
                  fVar3 = auVar26._0_4_;
                  auVar38._0_4_ = fVar3 * 0.22222222;
                  fVar5 = auVar26._4_4_;
                  auVar38._4_4_ = fVar5 * 0.22222222;
                  fVar7 = auVar26._8_4_;
                  auVar38._8_4_ = fVar7 * 0.22222222;
                  fVar10 = auVar26._12_4_;
                  auVar38._12_4_ = fVar10 * 0.22222222;
                  fVar4 = auVar27._0_4_;
                  fVar6 = auVar27._4_4_;
                  fVar8 = auVar27._8_4_;
                  auVar25 = vsubps_avx(auVar33,auVar38);
                  uStack_8c = auVar25._0_4_ + fVar4 * -0.22222222;
                  local_88 = auVar25._4_4_ + fVar6 * -0.22222222;
                  fStack_84 = auVar25._8_4_ + fVar8 * -0.22222222;
                  local_80 = auVar38._0_4_ + auVar33._0_4_ + fVar4 * -0.22222222;
                  fStack_7c = auVar38._4_4_ + auVar33._4_4_ + fVar6 * -0.22222222;
                  auVar26._0_4_ = fVar24 * 0.011111111;
                  auVar26._4_4_ = fVar31 * 0.011111111;
                  auVar26._8_4_ = fVar32 * 0.011111111;
                  auVar26._12_4_ = fVar9 * 0.011111111;
                  auVar39._0_4_ = fVar3 * 0.022222223;
                  auVar39._4_4_ = fVar5 * 0.022222223;
                  auVar39._8_4_ = fVar7 * 0.022222223;
                  auVar39._12_4_ = fVar10 * 0.022222223;
                  uStack_78 = (Allocator *)
                              CONCAT44(fVar4 * 0.044444446 + auVar39._0_4_ + auVar26._0_4_,
                                       auVar38._8_4_ + auVar33._8_4_ + fVar8 * -0.22222222);
                  local_70 = fVar6 * 0.044444446 + auVar39._4_4_ + auVar26._4_4_;
                  fStack_6c = fVar8 * 0.044444446 + auVar39._8_4_ + auVar26._8_4_;
                  auVar25 = vsubps_avx(auVar26,auVar39);
                  fStack_68 = fVar4 * 0.044444446 + auVar25._0_4_;
                  fStack_64 = fVar6 * 0.044444446 + auVar25._4_4_;
                  fStack_60 = fVar8 * 0.044444446 + auVar25._8_4_;
                  auVar34._0_4_ = fVar24 * 0.022222223;
                  auVar34._4_4_ = fVar31 * 0.022222223;
                  auVar34._8_4_ = fVar32 * 0.022222223;
                  auVar34._12_4_ = fVar9 * 0.022222223;
                  auVar36._0_4_ = fVar3 * 0.011111111;
                  auVar36._4_4_ = fVar5 * 0.011111111;
                  auVar36._8_4_ = fVar7 * 0.011111111;
                  auVar36._12_4_ = fVar10 * 0.011111111;
                  fStack_5c = auVar36._0_4_ + auVar34._0_4_ + fVar4 * 0.0055555557;
                  local_58 = CONCAT44(auVar36._8_4_ + auVar34._8_4_ + fVar8 * 0.0055555557,
                                      auVar36._4_4_ + auVar34._4_4_ + fVar6 * 0.0055555557);
                  auVar25 = vsubps_avx(auVar34,auVar36);
                  local_50 = auVar25._0_4_ + fVar4 * 0.0055555557;
                  fStack_4c = auVar25._4_4_ + fVar6 * 0.0055555557;
                  fStack_48 = auVar25._8_4_ + fVar8 * 0.0055555557;
                  auVar25._0_12_ = auVar27._0_12_;
                  auVar25._12_4_ = auStack_44._12_4_;
                  auStack_44 = auVar25;
                  lVar21 = 8;
                  do {
                    fVar3 = *(float *)(local_98 + lVar21);
                    auVar35._4_4_ = fVar3;
                    auVar35._0_4_ = fVar3;
                    auVar35._8_4_ = fVar3;
                    auVar35._12_4_ = fVar3;
                    auVar37._8_8_ = 0;
                    auVar37._0_8_ = *(ulong *)((long)&uStack_a0 + lVar21);
                    auVar25 = vshufps_avx(auVar37,auVar37,0x14);
                    auVar27 = vmulps_avx512vl(auVar25,auVar14);
                    auVar26 = vshufps_avx(auVar27,auVar27,0xa5);
                    auVar25 = vhaddps_avx(auVar27,auVar27);
                    auVar26 = vsubps_avx(auVar27,auVar26);
                    auVar25 = vshufps_avx(auVar26,auVar25,0xcc);
                    auVar25 = vshufps_avx(auVar25,auVar25,0x78);
                    auVar26 = vfmadd231ps_avx512vl(auVar25,auVar35,auVar15);
                    auVar27 = vmulss_avx512f(auVar37,SUB6416(ZEXT464(0x3cb60b61),0));
                    auVar25 = vmovshdup_avx(auVar37);
                    auVar25 = vmulss_avx512f(auVar25,SUB6416(ZEXT464(0x3c360b61),0));
                    *puVar16 = (int)*(ulong *)((long)&uStack_a0 + lVar21);
                    *(undefined1 (*) [16])(puVar16 + 1) = auVar26;
                    puVar16[5] = auVar25._0_4_ + auVar27._0_4_ + fVar3 * 0.0055555557;
                    puVar16[6] = (auVar27._0_4_ - auVar25._0_4_) + fVar3 * 0.0055555557;
                    puVar16[7] = fVar3;
                    puVar16 = puVar16 + 8;
                    lVar21 = lVar21 + 0xc;
                  } while (lVar21 != 0x68);
                  uVar23 = uVar23 + 1;
                } while (uVar23 != uVar19);
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 != uVar11);
          }
          fStack_6c = (float)local_a8->w;
          sVar2 = local_a8->elemsize;
          fStack_68 = (float)local_a8->h;
          local_80 = (float)local_a8->elempack;
          uStack_78 = local_a8->allocator;
          local_58 = (long)(int)fStack_68 * (long)(int)fStack_6c;
          local_98._0_8_ =
               (long)local_a8->data +
               sVar2 * local_58 * (long)(iVar18 / (int)local_170) +
               (long)(iVar20 / (int)local_16c) * local_a8->cstep * sVar2;
          local_98._8_4_ = 0;
          uStack_8c = 0.0;
          local_88 = (float)sVar2;
          fStack_84 = (float)(sVar2 >> 0x20);
          local_70 = 2.8026e-45;
          fStack_64 = 1.4013e-45;
          fStack_60 = 1.4013e-45;
          pack_A_tile((Mat *)local_108,(Mat *)local_98,0x40,uVar11,uVar19);
          piVar12 = (int *)CONCAT44(uStack_8c,local_98._8_4_);
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + -1;
            UNLOCK();
            if (*piVar12 == 0) {
              if (uStack_78 == (Allocator *)0x0) {
                if ((void *)local_98._0_8_ != (void *)0x0) {
                  free((void *)local_98._0_8_);
                }
              }
              else {
                (*uStack_78->_vptr_Allocator[3])();
              }
            }
          }
          local_58 = 0;
          local_98._0_8_ = (void *)0x0;
          local_98._8_4_ = 0;
          uStack_8c = 0.0;
          local_88 = 0.0;
          fStack_84 = 0.0;
          local_80 = 0.0;
          local_70 = 0.0;
          fStack_6c = 0.0;
          fStack_68 = 0.0;
          fStack_64 = 0.0;
          fStack_60 = 0.0;
          iVar18 = iVar18 + local_170;
        } while (iVar18 < inch);
      }
      uVar11 = local_168;
      piVar12 = (int *)CONCAT44(local_108._12_4_,local_108._8_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if ((Allocator *)local_108._32_8_ == (Allocator *)0x0) {
            if ((undefined4 *)local_108._0_8_ != (undefined4 *)0x0) {
              free((void *)local_108._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_108._32_8_)[3])();
          }
        }
      }
      local_c8 = 0;
      local_108._0_8_ = (void *)0x0;
      local_108._8_4_ = 0;
      local_108._12_4_ = 0;
      local_108._16_8_ = 0;
      local_108._24_4_ = 0;
      stack0xffffffffffffff20 = (undefined1  [16])0x0;
      local_d0 = 0;
      uVar19 = (int)local_b8 + 1;
      uVar22 = (ulong)uVar19;
    } while (uVar19 != uVar11);
  }
  piVar12 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    const int M = outch;
    const int K = inch;
    const int B = 64;

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    Mat A_tileX(B * TILE_M * TILE_K, 1, opt.num_threads, 4u, (Allocator*)0);

    AT.create(TILE_K * TILE_M, B, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat A_tile = A_tileX.channel(get_omp_thread_num());

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_ii = std::min((M - i), TILE_M);
            const int max_kk = std::min((K - k), TILE_K);

            conv3x3s1_winograd63_transform_kernel_tile(kernel, A_tile, inch, i, max_ii, k, max_kk);

            Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

            pack_A_tile(A_tile, AT_tile, B, max_ii, max_kk);
        }
    }
}